

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

LPCWSTR __thiscall Js::RecyclableKeyValueDisplay::Value(RecyclableKeyValueDisplay *this,int radix)

{
  DBGPROP_ATTRIB_FLAGS *this_00;
  StringBuilder<Memory::ArenaAllocator> *this_01;
  LPCWSTR str;
  LPCWSTR str_00;
  ThreadContext *this_02;
  DebugManager *pDVar1;
  char16 *pcVar2;
  StringBuilder<Memory::ArenaAllocator> *builder;
  char16 *valueValue;
  char16 *keyValue;
  undefined1 local_c8 [8];
  RecyclableObjectDisplay valueDisplay;
  RecyclableObjectDisplay keyDisplay;
  ResolvedObject ro;
  int radix_local;
  RecyclableKeyValueDisplay *this_local;
  
  this_00 = &keyDisplay.defaultAttributes;
  ResolvedObject::ResolvedObject((ResolvedObject *)this_00);
  RecyclableObjectDisplay::RecyclableObjectDisplay
            ((RecyclableObjectDisplay *)&valueDisplay.defaultAttributes,(ResolvedObject *)this_00,0)
  ;
  RecyclableObjectDisplay::RecyclableObjectDisplay
            ((RecyclableObjectDisplay *)local_c8,(ResolvedObject *)this_00,0);
  str = RecyclableObjectDisplay::Value
                  ((RecyclableObjectDisplay *)&valueDisplay.defaultAttributes,radix);
  str_00 = RecyclableObjectDisplay::Value((RecyclableObjectDisplay *)local_c8,radix);
  this_02 = ScriptContext::GetThreadContext(this->scriptContext);
  pDVar1 = ThreadContext::GetDebugManager(this_02);
  this_01 = pDVar1->pCurrentInterpreterLocation->stringBuilder;
  StringBuilder<Memory::ArenaAllocator>::Reset(this_01);
  StringBuilder<Memory::ArenaAllocator>::Append(this_01,L'[');
  StringBuilder<Memory::ArenaAllocator>::AppendSz(this_01,str);
  StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<3ul>(this_01,(char16 (*) [3])0x17e0690);
  StringBuilder<Memory::ArenaAllocator>::AppendSz(this_01,str_00);
  StringBuilder<Memory::ArenaAllocator>::Append(this_01,L']');
  pcVar2 = StringBuilder<Memory::ArenaAllocator>::Detach(this_01);
  RecyclableObjectDisplay::~RecyclableObjectDisplay((RecyclableObjectDisplay *)local_c8);
  RecyclableObjectDisplay::~RecyclableObjectDisplay
            ((RecyclableObjectDisplay *)&valueDisplay.defaultAttributes);
  return pcVar2;
}

Assistant:

LPCWSTR RecyclableKeyValueDisplay::Value(int radix)
    {
        ResolvedObject ro;
        ro.scriptContext = scriptContext;

        ro.obj = key;
        RecyclableObjectDisplay keyDisplay(&ro);

        ro.obj = value;
        RecyclableObjectDisplay valueDisplay(&ro);

        // Note, RecyclableObjectDisplay::Value(int) uses the shared string builder
        // so we cannot call it while building our string below.  Call both before hand.
        const char16* keyValue = keyDisplay.Value(radix);
        const char16* valueValue = valueDisplay.Value(radix);

        StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
        builder->Reset();

        builder->Append('[');
        builder->AppendSz(keyValue);
        builder->AppendCppLiteral(_u(", "));
        builder->AppendSz(valueValue);
        builder->Append(']');

        return builder->Detach();
    }